

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::Init
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this)

{
  Arena *this_00;
  InnerMap *elem;
  
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    elem = (InnerMap *)operator_new(0x30);
    InnerMap::InnerMap(elem,0,0);
  }
  else {
    elem = (InnerMap *)
           Arena::AllocateAligned
                     (this_00,(type_info *)
                              &Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap
                               ::typeinfo,0x30);
    InnerMap::InnerMap(elem,0,this_00);
    Arena::AddListNode(this_00,elem,
                       internal::
                       arena_destruct_object<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap>
                      );
  }
  this->elements_ = elem;
  return;
}

Assistant:

void Init() {
    elements_ = Arena::Create<InnerMap>(arena_, 0, hasher(), Allocator(arena_));
  }